

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMallocTrace.cpp
# Opt level: O0

void malloc_hook(void)

{
  int iVar1;
  vector<SMTMap_*,_std::allocator<SMTMap_*>_> *this;
  SMTMap *this_00;
  long *in_FS_OFFSET;
  SMTMap *local_18;
  SMTMap *globalmap;
  int r;
  
  globalmap._4_4_ = 0;
  if (malloc_hook::simplemalloctrace_init_begined == 0) {
    printf("malloc hook begin\n");
    malloc_hook::simplemalloctrace_init_begined = 1;
    *(undefined4 *)(*in_FS_OFFSET + -4) = 1;
    libc_malloc = (MALLOC_FUNCTION)dlsym(0xffffffffffffffff,malloc_symbol);
    if (libc_malloc == (MALLOC_FUNCTION)0x0) {
      printf("*** wrapper does not find [%s] in libc.so\n");
      globalmap._4_4_ = 1;
    }
    else {
      libc_realloc = (REALLOC_FUNCTION)dlsym(0xffffffffffffffff,realloc_symbol);
      if (libc_realloc == (REALLOC_FUNCTION)0x0) {
        printf("*** wrapper does not find [%s] in libc.so\n");
        globalmap._4_4_ = 1;
      }
      else {
        libc_calloc = (CALLOC_FUNCTION)dlsym(0xffffffffffffffff,calloc_symbol);
        if (libc_calloc == (CALLOC_FUNCTION)0x0) {
          printf("*** wrapper does not find [%s] in libc.so\n");
          globalmap._4_4_ = 1;
        }
        else {
          libc_posix_memalign =
               (POSIX_MEMALIGN_FUNCTION)dlsym(0xffffffffffffffff,posix_memalign_symbol);
          if (libc_posix_memalign == (POSIX_MEMALIGN_FUNCTION)0x0) {
            printf("*** wrapper does not find [%s] in libc.so\n");
            globalmap._4_4_ = 1;
          }
          else {
            libc_aligned_alloc =
                 (ALIGNED_ALLOC_FUNCTION)dlsym(0xffffffffffffffff,aligned_alloc_symbol);
            if (libc_aligned_alloc == (ALIGNED_ALLOC_FUNCTION)0x0) {
              printf("*** wrapper does not find [%s] in libc.so\n");
              globalmap._4_4_ = 1;
            }
            else {
              libc_memalign = (MEMALIGN_FUNCTION)dlsym(0xffffffffffffffff,memalign_symbol);
              if (libc_memalign == (MEMALIGN_FUNCTION)0x0) {
                printf("*** wrapper does not find [%s] in libc.so\n");
                globalmap._4_4_ = 1;
              }
              else {
                libc_free = (FREE_FUNCTION)dlsym(0xffffffffffffffff,free_symbol);
                if (libc_free == (FREE_FUNCTION)0x0) {
                  printf("*** wrapper does not find [%s] in libc.so\n");
                  globalmap._4_4_ = 1;
                }
                else {
                  libc_cfree = (CFREE_FUNCTION)dlsym(0xffffffffffffffff,cfree_symbol);
                  if (libc_cfree == (CFREE_FUNCTION)0x0) {
                    printf("*** wrapper does not find [%s] in libc.so\n");
                    globalmap._4_4_ = 1;
                  }
                  else {
                    iVar1 = sem_init((sem_t *)&smtinit_sem,0,0);
                    if (iVar1 == 0) {
                      globalmap._4_4_ = 0;
                    }
                    else {
                      printf("*** semaphore init failed\n");
                      globalmap._4_4_ = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    *(undefined4 *)(*in_FS_OFFSET + -4) = 0;
    if (globalmap._4_4_ != 0) {
      exit(1);
    }
    printf("malloc hook done, let\'s post the semaphore\n");
    sem_post((sem_t *)&smtinit_sem);
    *(undefined4 *)(*in_FS_OFFSET + -8) = 1;
    this = (vector<SMTMap_*,_std::allocator<SMTMap_*>_> *)operator_new(0x18);
    memset(this,0,0x18);
    std::vector<SMTMap_*,_std::allocator<SMTMap_*>_>::vector(this);
    smtmaplist = this;
    if (this == (vector<SMTMap_*,_std::allocator<SMTMap_*>_> *)0x0) {
      printf("new AddressMap failed\n");
      exit(1);
    }
    this_00 = (SMTMap *)operator_new(0x440);
    SMTMap::SMTMap(this_00,"before main()","main()",0);
    if (this_00 != (SMTMap *)0x0) {
      local_18 = this_00;
      SMTMap::stopAt(this_00,"after main()","main()",0);
      std::vector<SMTMap_*,_std::allocator<SMTMap_*>_>::push_back(smtmaplist,&local_18);
    }
    *(undefined4 *)(*in_FS_OFFSET + -8) = 0;
  }
  else {
    printf("malloc hook init begined, let\'s wait for semaphore\n");
    sem_wait((sem_t *)&smtinit_sem);
    printf("wait semaphore done!\n");
  }
  return;
}

Assistant:

static void malloc_hook()
{
    static int simplemalloctrace_init_begined = 0;
    int r = 0;

    if (simplemalloctrace_init_begined) {
        SMTLOG("malloc hook init begined, let's wait for semaphore\n");
        sem_wait(&smtinit_sem);
        SMTLOG("wait semaphore done!\n");
        return;
    }
    
    SMTLOG("malloc hook begin\n");

    simplemalloctrace_init_begined = 1;

    calloc_for_dlsym = 1;
    do {
        libc_malloc = (MALLOC_FUNCTION)dlsym(RTLD_NEXT, malloc_symbol);
        if (!libc_malloc) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", malloc_symbol);
            r = 1;
            break;
        }
        libc_realloc = (REALLOC_FUNCTION)dlsym(RTLD_NEXT, realloc_symbol);
        if (!libc_realloc) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", realloc_symbol);
            r = 1;
            break;
        }
        libc_calloc = (CALLOC_FUNCTION)dlsym(RTLD_NEXT, calloc_symbol);
        if (!libc_calloc) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", calloc_symbol);
            r = 1;
            break;
        }
        libc_posix_memalign = (POSIX_MEMALIGN_FUNCTION)dlsym(RTLD_NEXT, posix_memalign_symbol);
        if (!libc_posix_memalign) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", posix_memalign_symbol);
            r = 1;
            break;
        }
        libc_aligned_alloc = (ALIGNED_ALLOC_FUNCTION)dlsym(RTLD_NEXT, aligned_alloc_symbol);
        if (!libc_aligned_alloc) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", aligned_alloc_symbol);
            r = 1;
            break;
        }
        libc_memalign = (MEMALIGN_FUNCTION)dlsym(RTLD_NEXT, memalign_symbol);
        if (!libc_memalign) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", memalign_symbol);
            r = 1;
            break;
        }
        libc_free = (FREE_FUNCTION)dlsym(RTLD_NEXT, free_symbol);
        if (!libc_free) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", free_symbol);
            r = 1;
            break;
        }
        libc_cfree = (CFREE_FUNCTION)dlsym(RTLD_NEXT, cfree_symbol);
        if (!libc_cfree) {
            SMTLOG("*** wrapper does not find [%s] in libc.so\n", cfree_symbol);
            r = 1;
            break;
        }

        if (sem_init(&smtinit_sem, 0, 0)) {
            SMTLOG("*** semaphore init failed\n");
            r = 1;
            break;
        }

        r = 0;
    } while(0);
    calloc_for_dlsym = 0;

    if (r)
        exit(1);

    SMTLOG("malloc hook done, let's post the semaphore\n");
    sem_post(&smtinit_sem);
    
    use_origin_malloc = 1;
    smtmaplist = new std::vector<SMTMap*>();
    if (!smtmaplist) {
        SMTLOG("new AddressMap failed\n");
        exit(1);
    }
    SMTMap* globalmap = new SMTMap("before main()", "main()", 0);
    if (globalmap) {
        globalmap->stopAt("after main()", "main()", 0);
        smtmaplist->push_back(globalmap);
    }
    use_origin_malloc = 0;
}